

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int recover(lua_State *L,int status)

{
  CallInfo *pCVar1;
  StkId level;
  CallInfo *ci;
  StkId oldtop;
  int status_local;
  lua_State *L_local;
  
  pCVar1 = findpcall(L);
  if (pCVar1 != (CallInfo *)0x0) {
    level = (StkId)((long)&L->stack->value_ + pCVar1->extra);
    luaF_close(L,level);
    seterrorobj(L,status,level);
    L->ci = pCVar1;
    L->allowhook = (pCVar1->u).c.old_allowhook;
    L->nny = 0;
    luaD_shrinkstack(L);
    L->errfunc = (pCVar1->u).c.old_errfunc;
    pCVar1->callstatus = pCVar1->callstatus | 0x20;
    (pCVar1->u).c.status = (lu_byte)status;
  }
  L_local._4_4_ = (uint)(pCVar1 != (CallInfo *)0x0);
  return L_local._4_4_;
}

Assistant:

static int recover (lua_State *L, int status) {
  StkId oldtop;
  CallInfo *ci = findpcall(L);
  if (ci == NULL) return 0;  /* no recovery point */
  /* "finish" luaD_pcall */
  oldtop = restorestack(L, ci->extra);
  luaF_close(L, oldtop);
  seterrorobj(L, status, oldtop);
  L->ci = ci;
  L->allowhook = ci->u.c.old_allowhook;
  L->nny = 0;  /* should be zero to be yieldable */
  luaD_shrinkstack(L);
  L->errfunc = ci->u.c.old_errfunc;
  ci->callstatus |= CIST_STAT;  /* call has error status */
  ci->u.c.status = status;  /* (here it is) */
  return 1;  /* continue running the coroutine */
}